

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

void __thiscall
wasm::Precompute::reuseConstantNode<wasm::Break>(Precompute *this,Break *curr,Flow *flow)

{
  bool bVar1;
  size_t sVar2;
  Literal *other;
  RefFunc *this_00;
  Function *pFVar3;
  Module *pMVar4;
  Expression *pEVar5;
  Name NVar6;
  bool local_bb;
  HeapType heapType;
  RefFunc *r;
  char *local_60;
  RefNull *local_58;
  RefNull *n;
  Const *local_40;
  Const *c;
  Literal singleValue;
  Flow *flow_local;
  Break *curr_local;
  Precompute *this_local;
  
  singleValue.type.id = (uintptr_t)flow;
  bVar1 = Literals::isConcrete(&flow->values);
  if (!bVar1) {
    curr->value = (Expression *)0x0;
    goto LAB_020054e4;
  }
  if ((curr->value != (Expression *)0x0) &&
     (sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)flow),
     sVar2 == 1)) {
    other = Flow::getSingleValue(flow);
    wasm::Literal::Literal((Literal *)&c,other);
    bVar1 = wasm::Type::isNumber((Type *)&singleValue.field_0.func.super_IString.str._M_str);
    if (bVar1) {
      local_40 = Expression::dynCast<wasm::Const>(curr->value);
      if (local_40 == (Const *)0x0) goto LAB_0200548f;
      wasm::Literal::operator=(&local_40->value,(Literal *)&c);
      Const::finalize(local_40);
      Break::finalize(curr);
      n._0_4_ = 1;
    }
    else {
      bVar1 = wasm::Literal::isNull((Literal *)&c);
      if (bVar1) {
        local_58 = Expression::dynCast<wasm::RefNull>(curr->value);
        if (local_58 == (RefNull *)0x0) goto LAB_0200548f;
        local_60 = singleValue.field_0.func.super_IString.str._M_str;
        RefNull::finalize(local_58,(Type)singleValue.field_0.gcData.
                                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
        Break::finalize(curr);
        n._0_4_ = 1;
      }
      else {
        bVar1 = wasm::Type::isRef((Type *)&singleValue.field_0.func.super_IString.str._M_str);
        local_bb = false;
        if (bVar1) {
          r = (RefFunc *)
              wasm::Type::getHeapType((Type *)&singleValue.field_0.func.super_IString.str._M_str);
          local_bb = HeapType::isSignature((HeapType *)&r);
        }
        if ((local_bb == false) ||
           (this_00 = Expression::dynCast<wasm::RefFunc>(curr->value), this_00 == (RefFunc *)0x0)) {
LAB_0200548f:
          n._0_4_ = 0;
        }
        else {
          NVar6 = wasm::Literal::getFunc((Literal *)&c);
          heapType.id = NVar6.super_IString.str._M_len;
          wasm::Name::operator=(&this_00->func,(Name *)&heapType);
          pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                ).
                                super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                .
                                super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                              );
          pFVar3 = Module::getFunction(pMVar4,(Name)(this_00->func).super_IString.str);
          RefFunc::finalize(this_00,(HeapType)(pFVar3->type).id);
          Break::finalize(curr);
          n._0_4_ = 1;
        }
      }
    }
    wasm::Literal::~Literal((Literal *)&c);
    if ((int)n != 0) {
      return;
    }
  }
  pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                      ).
                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                      .
                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                    );
  pEVar5 = Flow::getConstExpression(flow,pMVar4);
  curr->value = pEVar5;
LAB_020054e4:
  Break::finalize(curr);
  return;
}

Assistant:

void reuseConstantNode(T* curr, Flow flow) {
    if (flow.values.isConcrete()) {
      // reuse a const / ref.null / ref.func node if there is one
      if (curr->value && flow.values.size() == 1) {
        Literal singleValue = flow.getSingleValue();
        if (singleValue.type.isNumber()) {
          if (auto* c = curr->value->template dynCast<Const>()) {
            c->value = singleValue;
            c->finalize();
            curr->finalize();
            return;
          }
        } else if (singleValue.isNull()) {
          if (auto* n = curr->value->template dynCast<RefNull>()) {
            n->finalize(singleValue.type);
            curr->finalize();
            return;
          }
        } else if (singleValue.type.isRef() &&
                   singleValue.type.getHeapType().isSignature()) {
          if (auto* r = curr->value->template dynCast<RefFunc>()) {
            r->func = singleValue.getFunc();
            auto heapType = getModule()->getFunction(r->func)->type;
            r->finalize(heapType);
            curr->finalize();
            return;
          }
        }
      }
      curr->value = flow.getConstExpression(*getModule());
    } else {
      curr->value = nullptr;
    }
    curr->finalize();
  }